

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_tmx_file(char *filename,Image *input_image,vector<Tile_*,_std::allocator<Tile_*>_> *tiles
                   ,vector<Tile_*,_std::allocator<Tile_*>_> *tilemap,TileSize tileSize)

{
  ostream *poVar1;
  int x;
  ulong uVar2;
  uint uVar3;
  uint index;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  string tileset_filename;
  ofstream out;
  
  std::__cxx11::string::string((string *)&tileset_filename,filename,(allocator *)&out);
  std::__cxx11::string::append((char *)&tileset_filename);
  write_tiles_to_png_image(tileset_filename._M_dataplus._M_p,input_image,tiles);
  uVar6 = input_image->width;
  uVar4 = input_image->height;
  std::ofstream::ofstream(&out);
  std::ofstream::open((char *)&out,(_Ios_Openmode)filename);
  std::operator<<((ostream *)&out,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n");
  std::operator<<((ostream *)&out,
                  "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\""
                 );
  uVar6 = uVar6 >> 3;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&out,uVar6);
  poVar1 = std::operator<<(poVar1,"\" height=\"");
  uVar4 = uVar4 >> 3;
  std::ostream::operator<<(poVar1,uVar4);
  poVar1 = std::operator<<((ostream *)&out,"\" tilewidth=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  poVar1 = std::operator<<(poVar1,"\" tileheight=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  std::operator<<(poVar1,"\">\n");
  poVar1 = std::operator<<((ostream *)&out," <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"")
  ;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  poVar1 = std::operator<<(poVar1,"\" tileheight=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,8);
  std::operator<<(poVar1,"\">\n");
  poVar1 = std::operator<<((ostream *)&out,"  <image source=\"");
  poVar1 = std::operator<<(poVar1,(string *)&tileset_filename);
  std::operator<<(poVar1,"\" />\n");
  std::operator<<((ostream *)&out," </tileset>\n");
  poVar1 = std::operator<<((ostream *)&out," <layer name=\"Bottom\" width=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar6);
  poVar1 = std::operator<<(poVar1,"\" height=\"");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar4);
  std::operator<<(poVar1,"\">\n");
  std::operator<<((ostream *)&out,"  <data encoding=\"csv\" >");
  uVar5 = (uint)((ulong)((long)(tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(tilemap->super__Vector_base<Tile_*,_std::allocator<Tile_*>_>)._M_impl
                              .super__Vector_impl_data._M_start) >> 3);
  if (tileSize == TILE_8x8) {
    uVar3 = 0;
    uVar4 = uVar5;
    if ((int)uVar5 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      get_tmx_tile_id(tilemap,uVar3);
      std::ostream::_M_insert<unsigned_long>((ulong)&out);
      if ((int)uVar3 < (int)(uVar5 - 1)) {
        std::operator<<((ostream *)&out,",");
      }
      if (uVar3 % uVar6 == uVar6 - 1) {
        std::operator<<((ostream *)&out,"\n");
      }
    }
  }
  else if (tileSize == TILE_8x16) {
    for (uVar3 = 0; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      index = uVar3 & 1 | (uVar3 >> 1) * uVar6 * 2;
      for (uVar2 = 0; uVar6 != (uint)uVar2; uVar2 = (ulong)((uint)uVar2 + 1)) {
        get_tmx_tile_id(tilemap,index);
        std::ostream::_M_insert<unsigned_long>((ulong)&out);
        if ((int)index < (int)(uVar5 - 1)) {
          std::operator<<((ostream *)&out,",");
        }
        if ((int)(uVar2 % (ulong)uVar6) == uVar6 - 1) {
          std::operator<<((ostream *)&out,"\n");
        }
        index = index + 2;
      }
    }
  }
  std::operator<<((ostream *)&out,"  </data>\n");
  std::operator<<((ostream *)&out," </layer>\n");
  std::operator<<((ostream *)&out,"</map>\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  std::__cxx11::string::~string((string *)&tileset_filename);
  return;
}

Assistant:

void write_tmx_file(const char *filename, Image *input_image, std::vector<Tile *> *tiles, std::vector<Tile *> *tilemap,
                    TileSize tileSize) {
    std::string tileset_filename = filename;

    tileset_filename += ".png";

    write_tiles_to_png_image(tileset_filename.c_str(), input_image, tiles);

    int tilemap_width = input_image->width / TILE_WIDTH;
    int tilemap_height = input_image->height / TILE_HEIGHT;

    std::ofstream out;
    out.open(filename);

    out << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
    out << "<map version=\"1.0\" orientation=\"orthogonal\" renderorder=\"right-down\" width=\"";
    out << tilemap_width << "\" height=\"" << tilemap_height;
    out << "\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_HEIGHT << "\">\n";
    out << " <tileset firstgid=\"1\" name=\"tileset\" tilewidth=\"" << TILE_WIDTH << "\" tileheight=\"" << TILE_WIDTH <<
    "\">\n";
    out << "  <image source=\"" << tileset_filename << "\" />\n";
    out << " </tileset>\n";


    out << " <layer name=\"Bottom\" width=\"" << tilemap_width << "\" height=\"" << tilemap_height << "\">\n";
    out << "  <data encoding=\"csv\" >";

    int total_tiles = tilemap->size();

    if (tileSize == TILE_8x8) {
        for (int i = 0; i < total_tiles; i++) {
            unsigned int id = get_tmx_tile_id(tilemap, i);

            out << id;

            if (i < total_tiles - 1) {
                out << ",";
            }

            if (i % tilemap_width == tilemap_width - 1) {
                out << "\n";
            }
        }
    } else if (tileSize == TILE_8x16) {
        for (int y = 0; y < tilemap_height; y++) {
            int i = (y / 2) * tilemap_width * 2 + (y % 2);
            for (int x = 0; x < tilemap_width; x++, i += 2) {
                unsigned int id = get_tmx_tile_id(tilemap, i);

                out << id;

                if (i < total_tiles - 1) {
                    out << ",";
                }

                if (x % tilemap_width == tilemap_width - 1) {
                    out << "\n";
                }
            }
        }
    }

    out << "  </data>\n";
    out << " </layer>\n";
    out << "</map>\n";

    out.close();
}